

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

bool __thiscall TSMuxer::doFlush(TSMuxer *this,int64_t newPCR,int64_t pcrGAP)

{
  bool bVar1;
  uint8_t *__dest;
  uint uVar2;
  uint len;
  uint8_t *newBuff;
  int roundBufLen;
  int lastBlockSize;
  int nullCnt;
  int64_t pcrGAP_local;
  int64_t newPCR_local;
  TSMuxer *this_local;
  
  flushTSFrame(this);
  if (0 < (this->super_AbstractMuxer).m_sectorSize) {
    roundBufLen = 0;
    if (this->m_processedBlockSize % (long)(this->super_AbstractMuxer).m_sectorSize != 0) {
      roundBufLen = (this->super_AbstractMuxer).m_sectorSize -
                    (int)(this->m_processedBlockSize %
                         (long)(this->super_AbstractMuxer).m_sectorSize);
    }
    writeNullPackets(this,roundBufLen / this->m_frameSize);
  }
  if ((this->m_m2tsMode & 1U) != 0) {
    processM2TSPCR(this,newPCR,pcrGAP);
  }
  uVar2 = this->m_outBufLen & 0x7ff;
  len = this->m_outBufLen & 0xfffff800;
  bVar1 = MuxerManager::isAsyncMode((this->super_AbstractMuxer).m_owner);
  if (bVar1) {
    if (uVar2 == 0) {
      MuxerManager::asyncWriteBuffer
                ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,this->m_outBuf,len,
                 this->m_muxFile);
      this->m_outBuf = (uint8_t *)0x0;
    }
    else {
      if ((this->super_AbstractMuxer).m_sectorSize != 0) {
        __assert_fail("m_sectorSize == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                      ,0x1b4,"bool TSMuxer::doFlush(const int64_t, const int64_t)");
      }
      __dest = (uint8_t *)operator_new__((long)(int)uVar2);
      memcpy(__dest,this->m_outBuf + (int)len,(long)(int)uVar2);
      MuxerManager::asyncWriteBuffer
                ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,this->m_outBuf,len,
                 this->m_muxFile);
      this->m_outBuf = __dest;
    }
  }
  else {
    MuxerManager::syncWriteBuffer
              ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,this->m_outBuf,len,
               this->m_muxFile);
    memmove(this->m_outBuf,this->m_outBuf + (int)len,(long)(int)uVar2);
  }
  this->m_outBufLen = uVar2;
  bVar1 = true;
  if ((this->super_AbstractMuxer).m_sectorSize != 0) {
    bVar1 = this->m_outBufLen == 0;
  }
  if (bVar1) {
    return true;
  }
  __assert_fail("!m_sectorSize || m_outBufLen == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                ,0x1c6,"bool TSMuxer::doFlush(const int64_t, const int64_t)");
}

Assistant:

bool TSMuxer::doFlush(const int64_t newPCR, const int64_t pcrGAP)
{
    flushTSFrame();

    if (m_sectorSize > 0)
    {
        // round file to sector size. It's also can be applied to any file in a m2ts mode
        int nullCnt = 0;
        if (m_processedBlockSize % m_sectorSize)
            nullCnt = m_sectorSize - static_cast<int>(m_processedBlockSize % m_sectorSize);
        writeNullPackets(nullCnt / m_frameSize);
    }

    if (m_m2tsMode)
        processM2TSPCR(newPCR, pcrGAP);

    const int lastBlockSize = m_outBufLen & (MuxerManager::PHYSICAL_SECTOR_SIZE - 1);  // last 64K of data
    const int roundBufLen = m_outBufLen & ~(MuxerManager::PHYSICAL_SECTOR_SIZE - 1);
    if (m_owner->isAsyncMode())
    {
        if (lastBlockSize > 0)
        {
            assert(m_sectorSize == 0);  // we should not be here in interleaved mode!
            const auto newBuff = new uint8_t[lastBlockSize];
            memcpy(newBuff, m_outBuf + roundBufLen, lastBlockSize);
            m_owner->asyncWriteBuffer(this, m_outBuf, roundBufLen, m_muxFile);
            m_outBuf = newBuff;
        }
        else
        {
            m_owner->asyncWriteBuffer(this, m_outBuf, roundBufLen, m_muxFile);
            m_outBuf = nullptr;
        }
    }
    else
    {
        m_owner->syncWriteBuffer(this, m_outBuf, roundBufLen, m_muxFile);
        memmove(m_outBuf, m_outBuf + roundBufLen, lastBlockSize);
    }
    m_outBufLen = lastBlockSize;
    assert(!m_sectorSize || m_outBufLen == 0);
    return true;
}